

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,initializer_list<TPZEqnArray<long_double>_> *list
          )

{
  undefined1 auVar1 [16];
  TPZEqnArray<long_double> *pTVar2;
  ulong uVar3;
  void *pvVar4;
  const_iterator pTVar5;
  long lVar6;
  long lVar7;
  initializer_list<TPZEqnArray<long_double>_> *in_RSI;
  undefined8 *in_RDI;
  ulong uVar8;
  TPZEqnArray<long_double> *aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff68;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff70;
  long local_70;
  TPZEqnArray<long_double> *this_00;
  const_iterator local_30;
  
  *in_RDI = &PTR__TPZVec_02550a28;
  in_RDI[1] = 0;
  pTVar2 = (TPZEqnArray<long_double> *)
           std::initializer_list<TPZEqnArray<long_double>_>::size(in_RSI);
  if (pTVar2 != (TPZEqnArray<long_double> *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pTVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x51e0),0);
    uVar8 = uVar3 + 0x10;
    if (SUB168(auVar1 * ZEXT816(0x51e0),8) != 0 || 0xffffffffffffffef < uVar3) {
      uVar8 = 0xffffffffffffffff;
    }
    this_00 = pTVar2;
    pvVar4 = operator_new__(uVar8);
    *(TPZEqnArray<long_double> **)((long)pvVar4 + 8) = this_00;
    lVar6 = (long)pvVar4 + 0x10;
    if (this_00 != (TPZEqnArray<long_double> *)0x0) {
      lVar7 = (long)this_00 * 0x51e0;
      local_70 = lVar6;
      do {
        TPZEqnArray<long_double>::TPZEqnArray(this_00);
        local_70 = local_70 + 0x51e0;
      } while (local_70 != lVar6 + lVar7);
    }
    in_RDI[1] = lVar6;
  }
  local_30 = std::initializer_list<TPZEqnArray<long_double>_>::begin(in_RSI);
  pTVar5 = std::initializer_list<TPZEqnArray<long_double>_>::end
                     ((initializer_list<TPZEqnArray<long_double>_> *)in_stack_ffffffffffffff70);
  for (; local_30 != pTVar5; local_30 = local_30 + 1) {
    TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  in_RDI[2] = pTVar2;
  in_RDI[3] = pTVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}